

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O1

UBool collator_cleanup(void)

{
  Locale *pLVar1;
  Locale *pLVar2;
  void *in_RSI;
  long lVar3;
  
  if (gService != (ICULocaleService *)0x0) {
    (*(gService->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[1])();
    gService = (ICULocaleService *)0x0;
  }
  pLVar2 = availableLocaleList;
  LOCK();
  gServiceInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  if (availableLocaleList != (Locale *)0x0) {
    pLVar1 = availableLocaleList + -1;
    if (*(long *)&availableLocaleList[-1].fIsBogus != 0) {
      lVar3 = *(long *)&availableLocaleList[-1].fIsBogus * 0xe0;
      do {
        icu_63::Locale::~Locale((Locale *)(pLVar2[-1].language + lVar3 + -8));
        lVar3 = lVar3 + -0xe0;
      } while (lVar3 != 0);
    }
    icu_63::UMemory::operator_delete__((UMemory *)&pLVar1->fIsBogus,in_RSI);
    availableLocaleList = (Locale *)0x0;
  }
  availableLocaleListCount = 0;
  LOCK();
  gAvailableLocaleListInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV collator_cleanup(void) {
#if !UCONFIG_NO_SERVICE
    if (gService) {
        delete gService;
        gService = NULL;
    }
    gServiceInitOnce.reset();
#endif
    if (availableLocaleList) {
        delete []availableLocaleList;
        availableLocaleList = NULL;
    }
    availableLocaleListCount = 0;
    gAvailableLocaleListInitOnce.reset();
    return TRUE;
}